

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfData.c
# Opt level: O0

void Cnf_ReadMsops(char **ppSopSizes,char ***ppSops)

{
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  int local_174;
  uint local_170;
  int Lit;
  int uCube;
  int uTruth;
  int Size;
  int b;
  int k;
  int i;
  char **pSops;
  char *pSopSizes;
  char *pMemory;
  char *pPrev;
  char Map [256];
  uint uMasks [4] [2];
  char ***ppSops_local;
  char **ppSopSizes_local;
  
  Map[0xf8] = 'U';
  Map[0xf9] = 'U';
  Map[0xfa] = '\0';
  Map[0xfb] = '\0';
  Map[0xfc] = -0x56;
  Map[0xfd] = -0x56;
  Map[0xfe] = '\0';
  Map[0xff] = '\0';
  for (b = 0; b < 0x100; b = b + 1) {
    Map[(long)b + -8] = -1;
  }
  for (b = 0; b < 0x51; b = b + 1) {
    Map[(long)(int)"!#&()*+,-.0123456789:;<=>?ABCDEFGHIJKLMNOPQRSTUVWXYZ[]abcdefghijklmnopqrstuvwxyz|"
                   [b] + -8] = (char)b;
  }
  for (uCube = 0; s_Data4[uCube] != (char *)0x0 && uCube < 100000; uCube = uCube + 1) {
  }
  if (uCube < 100000) {
    pcVar1 = (char *)malloc((long)(uCube * 0x4b));
    for (b = 0; b < uCube; b = b + 1) {
      for (Size = 0; Size < 0x4b; Size = Size + 1) {
        if (s_Data4[b][Size] == ' ') {
          pcVar1[b * 0x4b + Size] = -1;
        }
        else {
          pcVar1[b * 0x4b + Size] = Map[(long)(int)s_Data4[b][Size] + -8];
        }
      }
    }
    pcVar2 = (char *)malloc(0x10000);
    ppcVar3 = (char **)malloc(0x80000);
    *pcVar2 = '\0';
    *ppcVar3 = (char *)0x0;
    Size = 0;
    b = 1;
    pMemory = pcVar1;
    while (b < 0x10000) {
      if (pcVar1[Size] == -1) {
        pcVar2[b] = ((char)pcVar1 + (char)Size) - (char)pMemory;
        ppcVar3[b] = pMemory;
        pMemory = pcVar1 + (long)Size + 1;
        b = b + 1;
      }
      Size = Size + 1;
    }
    *ppSopSizes = pcVar2;
    *ppSops = ppcVar3;
    b = 1;
    while( true ) {
      if (0xffff < b) {
        return;
      }
      Lit = 0;
      for (Size = 0; Size < pcVar2[b]; Size = Size + 1) {
        local_170 = 0xffff;
        local_174 = (int)ppcVar3[b][Size];
        for (uTruth = 3; -1 < uTruth; uTruth = uTruth + -1) {
          if (local_174 % 3 == 0) {
            local_170 = uMasks[(long)uTruth + -1][0] & local_170;
          }
          else if (local_174 % 3 == 1) {
            local_170 = uMasks[(long)uTruth + -1][1] & local_170;
          }
          local_174 = local_174 / 3;
        }
        Lit = local_170 | Lit;
      }
      if (Lit != b) break;
      b = b + 1;
    }
    __assert_fail("uTruth == i",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfData.c"
                  ,0x11fb,"void Cnf_ReadMsops(char **, char ***)");
  }
  __assert_fail("Size < 100000",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfData.c"
                ,0x11cd,"void Cnf_ReadMsops(char **, char ***)");
}

Assistant:

void Cnf_ReadMsops( char ** ppSopSizes, char *** ppSops )
{
    unsigned uMasks[4][2] = {
        { 0x5555, 0xAAAA },
        { 0x3333, 0xCCCC },
        { 0x0F0F, 0xF0F0 },
        { 0x00FF, 0xFF00 }
    };
    char Map[256], * pPrev, * pMemory;
    char * pSopSizes, ** pSops;
    int i, k, b, Size;

    // map chars into their numbers
    for ( i = 0; i < 256; i++ )
        Map[i] = (char)(-1);
    for ( i = 0; i < 81; i++ )
        Map[(int)s_Data3[i]] = (char)i;

    // count the number of strings
    for ( Size = 0; s_Data4[Size] && Size < 100000; Size++ );
    assert( Size < 100000 );

    // allocate memory
    pMemory = ABC_ALLOC( char, Size * 75 );
    // copy the array into memory
    for ( i = 0; i < Size; i++ )
        for ( k = 0; k < 75; k++ )
            if ( s_Data4[i][k] == ' ' )
                pMemory[i*75+k] = (char)(-1);
            else
                pMemory[i*75+k] = Map[(int)s_Data4[i][k]];

    // set pointers and compute SOP sizes
    pSopSizes = ABC_ALLOC( char, 65536 );
    pSops = ABC_ALLOC( char *, 65536 );
    pSopSizes[0] = 0;
    pSops[0] = NULL;
    pPrev = pMemory;
    for ( k = 0, i = 1; i < 65536; k++ )
        if ( pMemory[k] == (char)(-1) )
        {
            pSopSizes[i] = pMemory + k - pPrev; 
            pSops[i++] = pPrev;
            pPrev = pMemory + k + 1;
        }
    *ppSopSizes = pSopSizes;
    *ppSops = pSops;

    // verify the results - derive truth table from SOP
    for ( i = 1; i < 65536; i++ )
    {
        int uTruth = 0, uCube, Lit;
        for ( k = 0; k < pSopSizes[i]; k++ )
        {
            uCube = 0xFFFF;
            Lit = pSops[i][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Lit % 3 == 0 )
                    uCube &= uMasks[b][0];
                else if ( Lit % 3 == 1 )
                    uCube &= uMasks[b][1];
                Lit = Lit / 3;
            }
            uTruth |= uCube;
        }
        assert( uTruth == i );
    }
}